

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O2

int __thiscall
rr::SingleSampleLineRasterizer::init(SingleSampleLineRasterizer *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  Vector<float,_4> *in_RDX;
  long lVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  float in_XMM0_Da;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 local_50 [8];
  long local_48;
  Vector<long,_2> widthOffset;
  
  tcu::operator-((tcu *)&widthOffset,in_RDX,(Vector<float,_4> *)ctx);
  fVar16 = -(float)widthOffset.m_data[0];
  if (-(float)widthOffset.m_data[0] <= (float)widthOffset.m_data[0]) {
    fVar16 = (float)widthOffset.m_data[0];
  }
  tcu::operator-((tcu *)local_50,in_RDX,(Vector<float,_4> *)ctx);
  fVar17 = -(float)local_50._4_4_;
  if (-(float)local_50._4_4_ <= (float)local_50._4_4_) {
    fVar17 = (float)local_50._4_4_;
  }
  if (in_XMM0_Da <= 1.0) {
    iVar6 = 1;
  }
  else {
    fVar15 = floorf(in_XMM0_Da + 0.5);
    iVar6 = (int)fVar15;
  }
  local_50 = (undefined1  [8])-(ulong)(fVar16 < fVar17);
  local_48 = (ulong)(fVar16 < fVar17) - 1;
  tcu::operator*((long)(iVar6 * 0x100 + -0x100 >> 1),(Vector<long,_2> *)local_50);
  uVar13 = -(uint)(*(float *)ctx < 0.0);
  lVar2 = (long)(*(float *)ctx * 256.0 + (float)(~uVar13 & 0x3f000000 | uVar13 & 0xbf000000)) +
          CONCAT44(widthOffset.m_data[0]._4_4_,(float)widthOffset.m_data[0]);
  uVar13 = -(uint)(*(float *)(ctx + 4) < 0.0);
  lVar7 = (long)(*(float *)(ctx + 4) * 256.0 + (float)(~uVar13 & 0x3f000000 | uVar13 & 0xbf000000))
          + widthOffset.m_data[1];
  uVar13 = -(uint)(in_RDX->m_data[0] < 0.0);
  uVar14 = -(uint)(in_RDX->m_data[1] < 0.0);
  lVar3 = (long)(in_RDX->m_data[0] * 256.0 + (float)(~uVar13 & 0x3f000000 | uVar13 & 0xbf000000)) +
          CONCAT44(widthOffset.m_data[0]._4_4_,(float)widthOffset.m_data[0]);
  lVar5 = (long)(in_RDX->m_data[1] * 256.0 + (float)(~uVar14 & 0x3f000000 | uVar14 & 0xbf000000)) +
          widthOffset.m_data[1];
  lVar10 = lVar3;
  if (lVar2 < lVar3) {
    lVar10 = lVar2;
  }
  if (lVar3 < lVar2) {
    lVar3 = lVar2;
  }
  lVar10 = lVar10 + -0x100;
  lVar2 = lVar5;
  if (lVar7 < lVar5) {
    lVar2 = lVar7;
  }
  if (lVar5 < lVar7) {
    lVar5 = lVar7;
  }
  lVar2 = lVar2 + -0x100;
  if (fVar17 <= fVar16) {
    lVar7 = 0xffffffff00;
    if (-1 < lVar10) {
      lVar7 = -1;
    }
    iVar11 = (this->m_viewport).m_data[0];
    iVar4 = (this->m_viewport).m_data[1];
    iVar9 = (this->m_viewport).m_data[2] + iVar11 + -1;
    iVar8 = (int)((ulong)(lVar7 + lVar10) >> 8);
    iVar12 = iVar9;
    if (iVar8 < iVar9) {
      iVar12 = iVar8;
    }
    if (iVar8 < iVar11) {
      iVar12 = iVar11;
    }
    iVar8 = (int)((ulong)(lVar3 + 0x200) >> 8);
    if (lVar3 + 0x100 < 0) {
      iVar8 = (int)((ulong)(lVar3 + 0x101) >> 8);
    }
    if (iVar8 < iVar9) {
      iVar9 = iVar8;
    }
    if (iVar8 < iVar11) {
      iVar9 = iVar11;
    }
    lVar3 = 0xffffffff00;
    if (-1 < lVar2) {
      lVar3 = -1;
    }
    iVar8 = iVar4 + (this->m_viewport).m_data[3] + -1;
    iVar4 = iVar4 - iVar6;
    iVar6 = (int)((ulong)(lVar3 + lVar2) >> 8);
    iVar11 = iVar8;
    if (iVar6 < iVar8) {
      iVar11 = iVar6;
    }
    if (iVar6 < iVar4) {
      iVar11 = iVar4;
    }
    iVar6 = (int)((ulong)(lVar5 + 0x101) >> 8);
    if (-1 < lVar5 + 0x100) {
      iVar6 = (int)((ulong)(lVar5 + 0x200) >> 8);
    }
    if (iVar6 < iVar8) {
      iVar8 = iVar6;
    }
    if (iVar6 < iVar4) {
      iVar8 = iVar4;
    }
  }
  else {
    lVar7 = 0xffffffff00;
    if (-1 < lVar2) {
      lVar7 = -1;
    }
    iVar4 = (this->m_viewport).m_data[0];
    iVar12 = (this->m_viewport).m_data[1];
    iVar8 = (this->m_viewport).m_data[3] + iVar12 + -1;
    iVar9 = (int)((ulong)(lVar7 + lVar2) >> 8);
    iVar11 = iVar8;
    if (iVar9 < iVar8) {
      iVar11 = iVar9;
    }
    if (iVar9 < iVar12) {
      iVar11 = iVar12;
    }
    iVar9 = (int)((ulong)(lVar5 + 0x200) >> 8);
    if (lVar5 + 0x100 < 0) {
      iVar9 = (int)((ulong)(lVar5 + 0x101) >> 8);
    }
    if (iVar9 < iVar8) {
      iVar8 = iVar9;
    }
    if (iVar9 < iVar12) {
      iVar8 = iVar12;
    }
    lVar5 = 0xffffffff00;
    if (-1 < lVar10) {
      lVar5 = -1;
    }
    iVar9 = iVar4 + (this->m_viewport).m_data[2] + -1;
    iVar4 = iVar4 - iVar6;
    iVar6 = (int)((ulong)(lVar5 + lVar10) >> 8);
    iVar12 = iVar9;
    if (iVar6 < iVar9) {
      iVar12 = iVar6;
    }
    if (iVar6 < iVar4) {
      iVar12 = iVar4;
    }
    iVar6 = (int)((ulong)(lVar3 + 0x101) >> 8);
    if (-1 < lVar3 + 0x100) {
      iVar6 = (int)((ulong)(lVar3 + 0x200) >> 8);
    }
    if (iVar6 < iVar9) {
      iVar9 = iVar6;
    }
    if (iVar6 < iVar4) {
      iVar9 = iVar4;
    }
  }
  (this->m_bboxMin).m_data[0] = iVar12;
  (this->m_bboxMax).m_data[0] = iVar9;
  (this->m_bboxMin).m_data[1] = iVar11;
  (this->m_bboxMax).m_data[1] = iVar8;
  this->m_lineWidth = in_XMM0_Da;
  uVar1 = *(undefined8 *)(ctx + 8);
  *(undefined8 *)(this->m_v0).m_data = *(undefined8 *)ctx;
  *(undefined8 *)((this->m_v0).m_data + 2) = uVar1;
  uVar1 = *(undefined8 *)(in_RDX->m_data + 2);
  *(undefined8 *)(this->m_v1).m_data = *(undefined8 *)in_RDX->m_data;
  *(undefined8 *)((this->m_v1).m_data + 2) = uVar1;
  uVar1 = *(undefined8 *)(this->m_bboxMin).m_data;
  *(undefined8 *)(this->m_curPos).m_data = uVar1;
  this->m_curRowFragment = 0;
  return (int)uVar1;
}

Assistant:

void SingleSampleLineRasterizer::init (const tcu::Vec4& v0, const tcu::Vec4& v1, float lineWidth)
{
	const bool						isXMajor		= de::abs((v1 - v0).x()) >= de::abs((v1 - v0).y());

	// Bounding box \note: with wide lines, the line is actually moved as in the spec
	const deInt32					lineWidthPixels	= (lineWidth > 1.0f) ? (deInt32)floor(lineWidth + 0.5f) : 1;

	const tcu::Vector<deInt64,2>	widthOffset		= (isXMajor ? tcu::Vector<deInt64,2>(0, -1) : tcu::Vector<deInt64,2>(-1, 0)) * (toSubpixelCoord(lineWidthPixels - 1) / 2);

	const deInt64					x0				= toSubpixelCoord(v0.x()) + widthOffset.x();
	const deInt64					y0				= toSubpixelCoord(v0.y()) + widthOffset.y();
	const deInt64					x1				= toSubpixelCoord(v1.x()) + widthOffset.x();
	const deInt64					y1				= toSubpixelCoord(v1.y()) + widthOffset.y();

	// line endpoints might be perturbed, add some margin
	const deInt64					xMin			= de::min(x0, x1) - toSubpixelCoord(1);
	const deInt64					xMax			= de::max(x0, x1) + toSubpixelCoord(1);
	const deInt64					yMin			= de::min(y0, y1) - toSubpixelCoord(1);
	const deInt64					yMax			= de::max(y0, y1) + toSubpixelCoord(1);

	// Remove invisible area

	if (isXMajor)
	{
		// clamp to viewport in major direction
		m_bboxMin.x() = de::clamp(floorSubpixelToPixelCoord(xMin, true), m_viewport.x(), m_viewport.x() + m_viewport.z() - 1);
		m_bboxMax.x() = de::clamp(ceilSubpixelToPixelCoord (xMax, true), m_viewport.x(), m_viewport.x() + m_viewport.z() - 1);

		// clamp to padded viewport in minor direction (wide lines might bleed over viewport in minor direction)
		m_bboxMin.y() = de::clamp(floorSubpixelToPixelCoord(yMin, true), m_viewport.y() - lineWidthPixels, m_viewport.y() + m_viewport.w() - 1);
		m_bboxMax.y() = de::clamp(ceilSubpixelToPixelCoord (yMax, true), m_viewport.y() - lineWidthPixels, m_viewport.y() + m_viewport.w() - 1);
	}
	else
	{
		// clamp to viewport in major direction
		m_bboxMin.y() = de::clamp(floorSubpixelToPixelCoord(yMin, true), m_viewport.y(), m_viewport.y() + m_viewport.w() - 1);
		m_bboxMax.y() = de::clamp(ceilSubpixelToPixelCoord (yMax, true), m_viewport.y(), m_viewport.y() + m_viewport.w() - 1);

		// clamp to padded viewport in minor direction (wide lines might bleed over viewport in minor direction)
		m_bboxMin.x() = de::clamp(floorSubpixelToPixelCoord(xMin, true), m_viewport.x() - lineWidthPixels, m_viewport.x() + m_viewport.z() - 1);
		m_bboxMax.x() = de::clamp(ceilSubpixelToPixelCoord (xMax, true), m_viewport.x() - lineWidthPixels, m_viewport.x() + m_viewport.z() - 1);
	}

	m_lineWidth = lineWidth;

	m_v0 = v0;
	m_v1 = v1;

	m_curPos = m_bboxMin;
	m_curRowFragment = 0;
}